

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalysisScopeVisitor.h
# Opt level: O0

bool slang::analysis::hasUnusedAttrib(Compilation *compilation,Symbol *symbol)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  bool bVar1;
  reference ppAVar2;
  basic_string_view<char,_std::char_traits<char>_> __y;
  AttributeSymbol *attr;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *__range2;
  AttributeSymbol *in_stack_00000090;
  basic_string_view<char,_std::char_traits<char>_> in_stack_ffffffffffffff78;
  ConstantValue *this;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *in_stack_ffffffffffffff88;
  size_t sVar3;
  char *pcVar4;
  __normal_iterator<const_slang::ast::AttributeSymbol_*const_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>
  local_38;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> local_30;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *local_20;
  
  local_30 = ast::Compilation::getAttributes
                       ((Compilation *)in_stack_ffffffffffffff78._M_str,
                        (Symbol *)in_stack_ffffffffffffff78._M_len);
  local_20 = &local_30;
  local_38._M_current =
       (AttributeSymbol **)
       std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>::begin
                 ((span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *)
                  in_stack_ffffffffffffff78._M_len);
  std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>::end
            (in_stack_ffffffffffffff88);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::AttributeSymbol_*const_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::AttributeSymbol_*const_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff78._M_str,
                       (__normal_iterator<const_slang::ast::AttributeSymbol_*const_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff78._M_len);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return false;
    }
    ppAVar2 = __gnu_cxx::
              __normal_iterator<const_slang::ast::AttributeSymbol_*const_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>
              ::operator*(&local_38);
    sVar3 = ((*ppAVar2)->super_Symbol).name._M_len;
    pcVar4 = ((*ppAVar2)->super_Symbol).name._M_str;
    __y = sv(in_stack_ffffffffffffff78._M_str,in_stack_ffffffffffffff78._M_len);
    __x._M_str = pcVar4;
    __x._M_len = sVar3;
    bVar1 = std::operator==(__x,__y);
    this = (ConstantValue *)in_stack_ffffffffffffff78._M_str;
    if (bVar1) break;
    in_stack_ffffffffffffff78 = sv((char *)this,in_stack_ffffffffffffff78._M_len);
    __x_00._M_str = pcVar4;
    __x_00._M_len = sVar3;
    bVar1 = std::operator==(__x_00,__y);
    this = (ConstantValue *)in_stack_ffffffffffffff78._M_str;
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_slang::ast::AttributeSymbol_*const_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>
    ::operator++(&local_38);
  }
  ast::AttributeSymbol::getValue(in_stack_00000090);
  bVar1 = slang::ConstantValue::isTrue(this);
  return bVar1;
}

Assistant:

static bool hasUnusedAttrib(const Compilation& compilation, const Symbol& symbol) {
    for (auto attr : compilation.getAttributes(symbol)) {
        if (attr->name == "unused"sv || attr->name == "maybe_unused"sv)
            return attr->getValue().isTrue();
    }
    return false;
}